

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::BufferQueue::GetUseMemoryBlock
          (BufferQueue *this,vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec,
          uint32_t max_size)

{
  uint32_t uVar1;
  uint32_t mem_len_2;
  uint32_t mem_len_1;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<cppnet::BufferBlock> temp;
  void *mem_2;
  void *mem_1;
  
  mem_1 = (void *)0x0;
  mem_2 = (void *)0x0;
  mem_len_1 = 0;
  mem_len_2 = 0;
  std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::reserve(block_vec,8);
  std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
             &(this->_buffer_list)._head.
              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
  uVar1 = 0;
  while (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) {
    BufferBlock::GetUseMemoryBlock
              (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &mem_1,&mem_len_1,&mem_2,&mem_len_2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_1 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_60._M_ptr = (element_type *)mem_1;
      local_60._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_1;
      std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                (block_vec,(Iovec *)&local_60);
      uVar1 = uVar1 + mem_len_1;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_60._M_ptr = (element_type *)mem_2;
      local_60._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_2;
      std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                (block_vec,(Iovec *)&local_60);
      uVar1 = uVar1 + mem_len_2;
    }
    if ((max_size - 1 < uVar1) ||
       (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)) break;
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               &((temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ListSlot<cppnet::BufferBlock>)._next.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return uVar1;
}

Assistant:

uint32_t BufferQueue::GetUseMemoryBlock(std::vector<Iovec>& block_vec, uint32_t max_size) {
    void* mem_1 = nullptr;
    void* mem_2 = nullptr;
    uint32_t mem_len_1 = 0;
    uint32_t mem_len_2 = 0;

    block_vec.reserve(__block_vec_default_size);
    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t cur_len = 0;
    while (temp) {
        temp->GetUseMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
        if (mem_len_1 > 0) {
            block_vec.emplace_back(Iovec(mem_1, mem_len_1));
            cur_len += mem_len_1;
        }
        if (mem_len_2 > 0) {
            block_vec.emplace_back(Iovec(mem_2, mem_len_2));
            cur_len += mem_len_2;
        }
        if (temp == _buffer_write) {
            break;
        }
        if (max_size > 0 && cur_len >= max_size) {
            break;
        }
        temp = temp->GetNext();
    }
    return cur_len;
}